

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode Curl_connecthost(connectdata *conn,Curl_dns_entry *remotehost)

{
  long *plVar1;
  SessionHandle *data;
  int iVar2;
  CURLcode CVar3;
  ulong uVar4;
  Curl_addrinfo *ai;
  timeval before;
  timeval local_30;
  
  data = conn->data;
  local_30 = curlx_tvnow();
  uVar4 = Curl_timeleft(data,&local_30,true);
  if ((long)uVar4 < 0) {
    Curl_failf(data,"Connection time-out");
    CVar3 = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    iVar2 = Curl_num_addresses(remotehost->addr);
    conn->num_addr = iVar2;
    conn->tempaddr[0] = remotehost->addr;
    conn->tempaddr[1] = (Curl_addrinfo *)0x0;
    conn->tempsock[0] = -1;
    conn->tempsock[1] = -1;
    Curl_expire(conn->data,200);
    ai = conn->tempaddr[0];
    conn->timeoutms_per_addr = uVar4 >> (ai->ai_next != (Curl_addrinfo *)0x0);
    do {
      CVar3 = singleipconnect(conn,ai,conn->tempsock);
      if (CVar3 == CURLE_OK) break;
      ai = conn->tempaddr[0]->ai_next;
      conn->tempaddr[0] = ai;
    } while (ai != (Curl_addrinfo *)0x0);
    if (conn->tempsock[0] != -1) {
      plVar1 = &(data->info).numconnects;
      *plVar1 = *plVar1 + 1;
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_connecthost(struct connectdata *conn,  /* context */
                          const struct Curl_dns_entry *remotehost)
{
  struct SessionHandle *data = conn->data;
  struct timeval before = Curl_tvnow();
  CURLcode res = CURLE_COULDNT_CONNECT;

  long timeout_ms = Curl_timeleft(data, &before, TRUE);

  if(timeout_ms < 0) {
    /* a precaution, no need to continue if time already is up */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  conn->num_addr = Curl_num_addresses(remotehost->addr);
  conn->tempaddr[0] = remotehost->addr;
  conn->tempaddr[1] = NULL;
  conn->tempsock[0] = CURL_SOCKET_BAD;
  conn->tempsock[1] = CURL_SOCKET_BAD;
  Curl_expire(conn->data, HAPPY_EYEBALLS_TIMEOUT);

  /* Max time for the next connection attempt */
  conn->timeoutms_per_addr =
    conn->tempaddr[0]->ai_next == NULL ? timeout_ms : timeout_ms / 2;

  /* start connecting to first IP */
  while(conn->tempaddr[0]) {
    res = singleipconnect(conn, conn->tempaddr[0], &(conn->tempsock[0]));
    if(res == CURLE_OK)
        break;
    conn->tempaddr[0] = conn->tempaddr[0]->ai_next;
  }

  if(conn->tempsock[0] == CURL_SOCKET_BAD)
    return res;

  data->info.numconnects++; /* to track the number of connections made */

  return CURLE_OK;
}